

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

string * deqp::gls::BuiltinPrecisionTests::Functions::vecName<float,2>(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int local_84;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  vecNamePrefix<float>();
  std::operator+(&local_30,&local_50,"vec");
  local_84 = 2;
  de::toString<int>(&local_80,&local_84);
  std::operator+(in_RDI,&local_30,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return in_RDI;
}

Assistant:

string vecName (void) { return vecNamePrefix<T>() + "vec" + de::toString(Size); }